

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV3MappingChannel(Parser *this,uint iChannel,Mesh *mesh)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  uint *iOut;
  char *pcVar6;
  uint iNumTFaces;
  uint iNumTVertices;
  int local_3c;
  uint local_38;
  uint local_34;
  
  local_34 = 0;
  local_3c = 0;
  local_38 = 0;
LAB_0041477d:
  pcVar2 = this->filePtr;
  if (*pcVar2 == '*') {
    this->filePtr = pcVar2 + 1;
    iVar4 = strncmp("MESH_NUMTVERTEX",pcVar2 + 1,0xf);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0x10];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_004147a6;
      pcVar6 = pcVar2 + 0x11;
      if (bVar1 == 0) {
        pcVar6 = pcVar2 + 0x10;
      }
      this->filePtr = pcVar6;
      iOut = &local_34;
LAB_004148a9:
      ParseLV4MeshLong(this,iOut);
      goto LAB_0041477d;
    }
LAB_004147a6:
    pcVar2 = this->filePtr;
    iVar4 = strncmp("MESH_NUMTVFACES",pcVar2,0xf);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0xf];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar6 = pcVar2 + 0x10;
        if (bVar1 == 0) {
          pcVar6 = pcVar2 + 0xf;
        }
        this->filePtr = pcVar6;
        iOut = &local_38;
        goto LAB_004148a9;
      }
    }
    pcVar2 = this->filePtr;
    iVar4 = strncmp("MESH_TVERTLIST",pcVar2,0xe);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0xe];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar6 = pcVar2 + 0xf;
        if (bVar1 == 0) {
          pcVar6 = pcVar2 + 0xe;
        }
        this->filePtr = pcVar6;
        ParseLV3MeshTListBlock(this,local_34,mesh,iChannel);
        goto LAB_0041477d;
      }
    }
    pcVar2 = this->filePtr;
    iVar4 = strncmp("MESH_TFACELIST",pcVar2,0xe);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0xe];
      if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
      goto LAB_004148f3;
      pcVar6 = pcVar2 + 0xf;
      if (bVar1 == 0) {
        pcVar6 = pcVar2 + 0xe;
      }
      this->filePtr = pcVar6;
      ParseLV3MeshTFaceListBlock(this,local_38,mesh,iChannel);
      goto LAB_0041477d;
    }
  }
LAB_004148f3:
  pbVar3 = (byte *)this->filePtr;
  bVar1 = *pbVar3;
  uVar5 = (uint)bVar1;
  if (bVar1 == 0x7b) {
    local_3c = local_3c + 1;
  }
  else if (bVar1 == 0x7d) {
    local_3c = local_3c + -1;
    if (local_3c == 0) {
      this->filePtr = (char *)(pbVar3 + 1);
      SkipToNextToken(this);
      return;
    }
  }
  else if (uVar5 == 0) {
    LogError(this,"Encountered unexpected EOL while parsing a *MESH_MAPPING_CHANNEL chunk (Level 3)"
            );
  }
  if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) && (this->bLastWasEndLine == false))
  {
    this->iLineNumber = this->iLineNumber + 1;
    this->bLastWasEndLine = true;
  }
  else {
    this->bLastWasEndLine = false;
  }
  this->filePtr = (char *)(pbVar3 + 1);
  goto LAB_0041477d;
}

Assistant:

void Parser::ParseLV3MappingChannel(unsigned int iChannel, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh,iChannel);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh, iChannel);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_MAPPING_CHANNEL");
    }
    return;
}